

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DockNodeIsDropAllowed(ImGuiWindow *host_window,ImGuiWindow *root_payload)

{
  bool bVar1;
  ImGuiWindow *in_RSI;
  ImGuiWindow *payload;
  int payload_n;
  int payload_count;
  int local_2c;
  int i;
  bool local_1;
  
  if ((in_RSI->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
     (bVar1 = ImGuiDockNode::IsSplitNode(in_RSI->DockNodeAsHost), !bVar1)) {
    if (in_RSI->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      local_2c = 1;
    }
    else {
      local_2c = (in_RSI->DockNodeAsHost->Windows).Size;
    }
    for (i = 0; i < local_2c; i = i + 1) {
      if (in_RSI->DockNodeAsHost != (ImGuiDockNode *)0x0) {
        ImVector<ImGuiWindow_*>::operator[](&in_RSI->DockNodeAsHost->Windows,i);
      }
      bVar1 = DockNodeIsDropAllowedOne(in_RSI,(ImGuiWindow *)CONCAT44(local_2c,i));
      if (bVar1) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool ImGui::DockNodeIsDropAllowed(ImGuiWindow* host_window, ImGuiWindow* root_payload)
{
    if (root_payload->DockNodeAsHost && root_payload->DockNodeAsHost->IsSplitNode())
        return true;

    const int payload_count = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows.Size : 1;
    for (int payload_n = 0; payload_n < payload_count; payload_n++)
    {
        ImGuiWindow* payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows[payload_n] : root_payload;
        if (DockNodeIsDropAllowedOne(payload, host_window))
            return true;
    }
    return false;
}